

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O1

dgListNode * __thiscall
dgList<dgList<dgConvexHull3DFace>::dgListNode_*>::Append
          (dgList<dgList<dgConvexHull3DFace>::dgListNode_*> *this,dgListNode **element)

{
  dgListNode *pdVar1;
  dgListNode *pdVar2;
  
  this->m_count = this->m_count + 1;
  pdVar1 = this->m_first;
  pdVar2 = (dgListNode *)malloc(0x20);
  if (pdVar1 == (dgListNode *)0x0) {
    pdVar2->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_00b6a9f0;
    pdVar2->m_info = *element;
    pdVar2->m_next = (dgListNode *)0x0;
    pdVar2->m_prev = (dgListNode *)0x0;
    this->m_first = pdVar2;
  }
  else {
    pdVar1 = this->m_last;
    pdVar2->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_00b6a9f0;
    pdVar2->m_info = *element;
    pdVar2->m_prev = pdVar1;
    pdVar2->m_next = (dgListNode *)0x0;
    if (pdVar1 != (dgListNode *)0x0) {
      pdVar1->m_next = pdVar2;
    }
    if (pdVar2->m_next != (dgListNode *)0x0) {
      pdVar2->m_next->m_prev = pdVar2;
    }
  }
  this->m_last = pdVar2;
  return pdVar2;
}

Assistant:

typename dgList<T>::dgListNode *dgList<T>::Append (const T &element)
{
	m_count	++;
	if (m_first == NULL) {
		m_first = HACD_NEW(dgListNode)(element, NULL, NULL);
		m_last = m_first;
	} else {
		m_last = HACD_NEW(dgListNode)(element, m_last, NULL);
	}
#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	return m_last;
}